

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O3

void __thiscall Kernel::Clause::destroyExceptInferenceObject(Clause *this)

{
  DHMap<Kernel::Literal_*,_unsigned_long,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  uint uVar1;
  void **head_1;
  void **head;
  
  this_00 = &this->_literalPositions->_data;
  if (this_00 != (DHMap<Kernel::Literal_*,_unsigned_long,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0
     ) {
    Lib::DHMap<Kernel::Literal_*,_unsigned_long,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (this_00);
    this_00->_timestamp = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
    this_00->_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = this_00;
  }
  Shell::PartialRedundancyHandler::destroyClauseData(this);
  uVar1 = (*(uint *)&this->field_0x38 & 0xfffff) * 8 + 0x7f & 0xfffffff0;
  if (uVar1 == 0) {
    *(undefined8 *)&this->super_Unit = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = this;
  }
  else if (uVar1 < 0x11) {
    *(undefined8 *)&this->super_Unit = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = this;
  }
  else if (uVar1 < 0x19) {
    *(undefined8 *)&this->super_Unit = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = this;
  }
  else if (uVar1 < 0x21) {
    *(undefined8 *)&this->super_Unit = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = this;
  }
  else if (uVar1 < 0x31) {
    *(undefined8 *)&this->super_Unit = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = this;
  }
  else {
    if (0x40 < uVar1) {
      ::operator_delete(this,0x10);
      return;
    }
    *(undefined8 *)&this->super_Unit = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = this;
  }
  return;
}

Assistant:

void Clause::destroyExceptInferenceObject()
{
  if (_literalPositions) {
    delete _literalPositions;
  }

  PartialRedundancyHandler::destroyClauseData(this);

  RSTAT_CTR_INC("clauses deleted");

  //We have to get sizeof(Clause) + (_length-1)*sizeof(Literal*)
  //this way, because _length-1 wouldn't behave well for
  //_length==0 on x64 platform.
  size_t size = sizeof(Clause) + _length * sizeof(Literal*);
  size -= sizeof(Literal*);

  DEALLOC_KNOWN(this, size,"Clause");
}